

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckArea(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  Bool BVar2;
  int iVar3;
  AttVal *local_28;
  AttVal *av;
  Bool HasAlt;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  for (local_28 = node->attributes; local_28 != (AttVal *)0x0; local_28 = local_28->next) {
    BVar2 = Level1_Enabled(doc);
    if ((((BVar2 != no) && (local_28 != (AttVal *)0x0)) && (local_28->dict != (Attribute *)0x0)) &&
       ((local_28->dict->id == TidyAttr_ALT && (local_28->value != (tmbstr)0x0)))) {
      bVar1 = true;
    }
    BVar2 = Level2_Enabled(doc);
    if (((BVar2 != no) && (local_28 != (AttVal *)0x0)) &&
       ((local_28->dict != (Attribute *)0x0 && (local_28->dict->id == TidyAttr_TARGET)))) {
      if (((local_28 == (AttVal *)0x0) || (local_28->value == (tmbstr)0x0)) ||
         (iVar3 = prvTidytmbstrcasecmp(local_28->value,"_new"), iVar3 != 0)) {
        if (((local_28 != (AttVal *)0x0) && (local_28->value != (tmbstr)0x0)) &&
           (iVar3 = prvTidytmbstrcasecmp(local_28->value,"_blank"), iVar3 == 0)) {
          prvTidyReportAccessError(doc,node,0x2f4);
        }
      }
      else {
        prvTidyReportAccessError(doc,node,0x2f3);
      }
    }
  }
  BVar2 = Level1_Enabled(doc);
  if ((BVar2 != no) && (!bVar1)) {
    prvTidyReportAccessError(doc,node,0x2a7);
  }
  return;
}

Assistant:

static void CheckArea( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    AttVal* av;

    /* Checks all attributes within the AREA element */
    for (av = node->attributes; av != NULL; av = av->next)
    {
        if (Level1_Enabled( doc ))
        {
            /*
              Checks for valid ALT attribute.
              The length of the alt text must be > 4 characters long
              but must be less than 150 characters long.
            */
                
            if ( attrIsALT(av) )
            {
                /* The check for validity */
                if (av->value != NULL) 
                {
                    HasAlt = yes;
                }
            }
        }

        if (Level2_Enabled( doc ))
        {
            if ( attrIsTARGET(av) )
            {
                if (AttrValueIs(av, "_new"))
                {
                    TY_(ReportAccessError)( doc, node, NEW_WINDOWS_REQUIRE_WARNING_NEW);
                }
                else if (AttrValueIs(av, "_blank"))
                {
                    TY_(ReportAccessError)( doc, node, NEW_WINDOWS_REQUIRE_WARNING_BLANK);
                }
            }
        }
    }

    if (Level1_Enabled( doc ))
    {
        /* AREA must contain alt text */
        if (HasAlt == no)
        {
            TY_(ReportAccessError)( doc, node, AREA_MISSING_ALT);
        }    
    }
}